

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

void __thiscall ON_Mesh::Append(ON_Mesh *this,int mesh_count,ON_Mesh **meshes)

{
  ON_3fVectorArray *pOVar1;
  ON_2fPointArray *this_00;
  ON_2dPointArray *this_01;
  ON_SimpleArray<ON_SurfaceCurvature> *this_02;
  ON_SimpleArray<ON_Color> *this_03;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ON_Mesh *pOVar6;
  ON_MeshParameters *pOVar7;
  ON_MeshCurvatureStats *this_04;
  ON_TextureCoordinates *pOVar8;
  int iVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  uint uVar14;
  uint *puVar15;
  ON_Interval *pOVar16;
  ON_MeshNgon *pOVar17;
  bool bVar18;
  bool bVar19;
  byte bVar20;
  byte bVar21;
  uint nvi;
  int iVar22;
  ON_MeshFace *pOVar23;
  ulong uVar24;
  bool bVar25;
  int iVar26;
  long lVar27;
  bool bVar28;
  int tci;
  int iVar29;
  int iVar30;
  ulong uVar31;
  uint uVar32;
  size_t newcap;
  ON_MeshParameters *a;
  ulong uVar33;
  bool bVar34;
  int face_count;
  uint uVar35;
  uint uVar36;
  bool bVar37;
  int tcimi;
  long lVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  double dVar44;
  double dVar45;
  int vertex_count;
  ON_MeshParameters *local_e8;
  ON_SHA1_Hash this_mesh_mp_hash;
  ON_SHA1_Hash mp_hash;
  undefined1 local_98 [16];
  ON_Interval local_88;
  ON_Interval local_78;
  ON_Interval local_68;
  double *local_50;
  double *local_48;
  double *local_40;
  double *local_38;
  
  if (meshes == (ON_Mesh **)0x0 || mesh_count < 1) {
    return;
  }
  iVar30 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  if (iVar30 < 1) {
    if ((this->m_F).m_capacity < 0) {
      iVar26 = (this->m_F).m_count;
    }
    else {
      (this->m_F).m_count = 0;
      iVar26 = 0;
    }
    if (iVar30 == 0) {
      bVar28 = true;
      bVar40 = false;
      bVar18 = true;
      bVar25 = true;
      bVar39 = true;
      bVar34 = true;
      bVar12 = false;
      bVar37 = true;
      bVar19 = true;
      bVar11 = true;
      goto LAB_0051c38b;
    }
  }
  else {
    iVar26 = (this->m_F).m_count;
  }
  if (iVar26 == 0) {
    bVar25 = true;
  }
  else {
    bVar25 = (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count == iVar26 && 0 < iVar26;
  }
  bVar34 = 0 < iVar30 && (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == iVar30;
  bVar12 = 0 < iVar30;
  bVar39 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == iVar30;
  bVar37 = bVar39 && bVar12;
  bVar18 = (this->m_K).m_count == iVar30 && bVar12;
  bVar19 = (this->m_C).m_count == iVar30 && bVar12;
  bVar40 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count == iVar30;
  bVar28 = bVar40 && bVar12;
  bVar11 = HasSynchronizedDoubleAndSinglePrecisionVertices(this);
  bVar40 = !bVar40 || !bVar12;
  bVar12 = !bVar39 || !bVar12;
  bVar39 = false;
LAB_0051c38b:
  iVar13 = NgonCount(this);
  if (iVar13 < 1) {
    bVar41 = false;
  }
  else {
    puVar15 = NgonMap(this);
    bVar41 = puVar15 != (uint *)0x0;
  }
  mp_hash.m_digest[0x10] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x10];
  mp_hash.m_digest[0x11] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x11];
  mp_hash.m_digest[0x12] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x12];
  mp_hash.m_digest[0x13] = ON_SHA1_Hash::EmptyContentHash.m_digest[0x13];
  mp_hash.m_digest[0] = ON_SHA1_Hash::EmptyContentHash.m_digest[0];
  mp_hash.m_digest[1] = ON_SHA1_Hash::EmptyContentHash.m_digest[1];
  mp_hash.m_digest[2] = ON_SHA1_Hash::EmptyContentHash.m_digest[2];
  mp_hash.m_digest[3] = ON_SHA1_Hash::EmptyContentHash.m_digest[3];
  mp_hash.m_digest[4] = ON_SHA1_Hash::EmptyContentHash.m_digest[4];
  mp_hash.m_digest[5] = ON_SHA1_Hash::EmptyContentHash.m_digest[5];
  mp_hash.m_digest[6] = ON_SHA1_Hash::EmptyContentHash.m_digest[6];
  mp_hash.m_digest[7] = ON_SHA1_Hash::EmptyContentHash.m_digest[7];
  mp_hash.m_digest[8] = ON_SHA1_Hash::EmptyContentHash.m_digest[8];
  mp_hash.m_digest[9] = ON_SHA1_Hash::EmptyContentHash.m_digest[9];
  mp_hash.m_digest[10] = ON_SHA1_Hash::EmptyContentHash.m_digest[10];
  mp_hash.m_digest[0xb] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xb];
  mp_hash.m_digest[0xc] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xc];
  mp_hash.m_digest[0xd] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xd];
  mp_hash.m_digest[0xe] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xe];
  mp_hash.m_digest[0xf] = ON_SHA1_Hash::EmptyContentHash.m_digest[0xf];
  if (bVar39) {
    bVar40 = (bool)(bVar40 ^ 1);
    bVar42 = true;
    local_e8 = (ON_MeshParameters *)0x0;
  }
  else {
    local_e8 = this->m_mesh_parameters;
    bVar42 = local_e8 != (ON_MeshParameters *)0x0;
    if (bVar42) {
      ON_MeshParameters::GeometrySettingsHash((ON_SHA1_Hash *)local_98,local_e8);
      mp_hash.m_digest[0x10] = local_88.m_t[0]._0_1_;
      mp_hash.m_digest[0x11] = local_88.m_t[0]._1_1_;
      mp_hash.m_digest[0x12] = local_88.m_t[0]._2_1_;
      mp_hash.m_digest[0x13] = local_88.m_t[0]._3_1_;
      mp_hash.m_digest[0] = local_98[0];
      mp_hash.m_digest[1] = local_98[1];
      mp_hash.m_digest[2] = local_98[2];
      mp_hash.m_digest[3] = local_98[3];
      mp_hash.m_digest[4] = local_98[4];
      mp_hash.m_digest[5] = local_98[5];
      mp_hash.m_digest[6] = local_98[6];
      mp_hash.m_digest[7] = local_98[7];
      mp_hash.m_digest[8] = local_98[8];
      mp_hash.m_digest[9] = local_98[9];
      mp_hash.m_digest[10] = local_98[10];
      mp_hash.m_digest[0xb] = local_98[0xb];
      mp_hash.m_digest[0xc] = local_98[0xc];
      mp_hash.m_digest[0xd] = local_98[0xd];
      mp_hash.m_digest[0xe] = local_98[0xe];
      mp_hash.m_digest[0xf] = local_98[0xf];
    }
    if ((bVar40 == false) &&
       (bVar40 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x240), bVar40)) {
      bVar40 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x250);
    }
    else {
      bVar40 = false;
    }
  }
  lVar27 = 0;
  do {
    ON_Interval::ON_Interval((ON_Interval *)(local_98 + lVar27));
    lVar27 = lVar27 + 0x10;
  } while (lVar27 != 0x20);
  local_38 = (double *)&this->field_0x240;
  local_40 = (double *)&this->field_0x250;
  bVar43 = (bVar40 & 0 < iVar30) != 0;
  pOVar16 = &ON_Interval::EmptyInterval;
  if (bVar43) {
    pOVar16 = (ON_Interval *)local_38;
  }
  local_98._0_8_ = pOVar16->m_t[0];
  local_98._8_8_ = pOVar16->m_t[1];
  pOVar16 = &ON_Interval::EmptyInterval;
  if (bVar43) {
    pOVar16 = (ON_Interval *)local_40;
  }
  local_88.m_t[0] = pOVar16->m_t[0];
  local_88.m_t[1] = pOVar16->m_t[1];
  if (bVar39 || bVar12 != false) {
    bVar12 = (bool)(bVar12 ^ 1);
  }
  else {
    bVar12 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x270);
    if (bVar12) {
      bVar12 = ON_Interval::IsIncreasing((ON_Interval *)&this->field_0x280);
    }
    else {
      bVar12 = false;
    }
  }
  lVar27 = 0;
  do {
    ON_Interval::ON_Interval((ON_Interval *)((long)local_78.m_t + lVar27));
    lVar27 = lVar27 + 0x10;
  } while (lVar27 != 0x20);
  local_50 = (double *)&this->field_0x270;
  local_48 = (double *)&this->field_0x280;
  bVar43 = (0 < iVar30 & bVar12) != 0;
  pOVar16 = &ON_Interval::EmptyInterval;
  if (bVar43) {
    pOVar16 = (ON_Interval *)local_50;
  }
  local_78.m_t[0] = pOVar16->m_t[0];
  local_78.m_t[1] = pOVar16->m_t[1];
  pOVar16 = &ON_Interval::EmptyInterval;
  if (bVar43) {
    pOVar16 = (ON_Interval *)local_48;
  }
  local_68.m_t[0] = pOVar16->m_t[0];
  local_68.m_t[1] = pOVar16->m_t[1];
  uVar14 = 0;
  if (bVar12 != false) {
    uVar14 = *(uint *)&this->m_packed_tex_rotate;
  }
  dVar44 = this->m_srf_scale[0];
  dVar45 = this->m_srf_scale[1];
  uVar36 = (uint)(0 < iVar30);
  uVar31 = (ulong)(uint)mesh_count;
  uVar33 = 0;
  iVar13 = iVar26;
  iVar29 = iVar30;
  while( true ) {
    bVar21 = (byte)uVar14;
    if (uVar31 == uVar33) break;
    pOVar6 = meshes[uVar33];
    uVar35 = uVar36;
    if ((pOVar6 != (ON_Mesh *)0x0) &&
       (iVar2 = (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, 0 < iVar2)) {
      if (bVar42) {
        pOVar7 = pOVar6->m_mesh_parameters;
        if (pOVar7 == (ON_MeshParameters *)0x0) {
          bVar42 = false;
        }
        else {
          ON_MeshParameters::GeometrySettingsHash(&this_mesh_mp_hash,pOVar7);
          if (local_e8 == (ON_MeshParameters *)0x0) {
            mp_hash.m_digest[0x10] = this_mesh_mp_hash.m_digest[0x10];
            mp_hash.m_digest[0x11] = this_mesh_mp_hash.m_digest[0x11];
            mp_hash.m_digest[0x12] = this_mesh_mp_hash.m_digest[0x12];
            mp_hash.m_digest[0x13] = this_mesh_mp_hash.m_digest[0x13];
            mp_hash.m_digest[0] = this_mesh_mp_hash.m_digest[0];
            mp_hash.m_digest[1] = this_mesh_mp_hash.m_digest[1];
            mp_hash.m_digest[2] = this_mesh_mp_hash.m_digest[2];
            mp_hash.m_digest[3] = this_mesh_mp_hash.m_digest[3];
            mp_hash.m_digest[4] = this_mesh_mp_hash.m_digest[4];
            mp_hash.m_digest[5] = this_mesh_mp_hash.m_digest[5];
            mp_hash.m_digest[6] = this_mesh_mp_hash.m_digest[6];
            mp_hash.m_digest[7] = this_mesh_mp_hash.m_digest[7];
            mp_hash.m_digest[8] = this_mesh_mp_hash.m_digest[8];
            mp_hash.m_digest[9] = this_mesh_mp_hash.m_digest[9];
            mp_hash.m_digest[10] = this_mesh_mp_hash.m_digest[10];
            mp_hash.m_digest[0xb] = this_mesh_mp_hash.m_digest[0xb];
            mp_hash.m_digest[0xc] = this_mesh_mp_hash.m_digest[0xc];
            mp_hash.m_digest[0xd] = this_mesh_mp_hash.m_digest[0xd];
            mp_hash.m_digest[0xe] = this_mesh_mp_hash.m_digest[0xe];
            mp_hash.m_digest[0xf] = this_mesh_mp_hash.m_digest[0xf];
            local_e8 = pOVar7;
          }
          else {
            bVar43 = ::operator!=(&this_mesh_mp_hash,&mp_hash);
            if (bVar43) {
              bVar42 = false;
            }
          }
        }
      }
      bVar10 = false;
      bVar43 = false;
      iVar3 = (pOVar6->m_F).m_count;
      iVar22 = 0;
      if (0 < iVar3) {
        iVar22 = iVar3;
      }
      if (bVar34) {
        iVar4 = (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
        if ((pOVar6->m_N).super_ON_SimpleArray<ON_3fVector>.m_count != iVar4) {
          bVar34 = bVar10;
        }
        if (iVar4 < 1) {
          bVar34 = bVar10;
        }
      }
      if (bVar37) {
        iVar4 = (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
        if ((pOVar6->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count != iVar4) {
          bVar37 = bVar10;
        }
        if (iVar4 < 1) {
          bVar37 = bVar10;
        }
      }
      if (bVar18) {
        iVar4 = (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
        if ((pOVar6->m_K).m_count != iVar4) {
          bVar18 = bVar43;
        }
        if (iVar4 < 1) {
          bVar18 = bVar43;
        }
      }
      if (bVar19) {
        iVar4 = (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
        if ((pOVar6->m_C).m_count != iVar4) {
          bVar19 = bVar43;
        }
        if (iVar4 < 1) {
          bVar19 = bVar43;
        }
      }
      if (bVar28) {
        iVar4 = (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
        if ((pOVar6->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count != iVar4) {
          bVar28 = false;
        }
        if (iVar4 < 1) {
          bVar28 = bVar43;
        }
      }
      if (bVar11 != false) {
        bVar43 = HasSynchronizedDoubleAndSinglePrecisionVertices(pOVar6);
        if (!bVar43) {
          bVar11 = false;
        }
      }
      if (((0 < iVar3) && (bVar25)) &&
         ((pOVar6->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count != iVar3)) {
        bVar25 = false;
      }
      if (bVar40 != false) {
        if (bVar28) {
          bVar40 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar6->field_0x240);
          if (bVar40) {
            bVar40 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar6->field_0x250);
            if (bVar40) {
              ON_Interval::Union((ON_Interval *)local_98,(ON_Interval *)&pOVar6->field_0x240);
              ON_Interval::Union(&local_88,(ON_Interval *)&pOVar6->field_0x250);
              bVar40 = true;
              goto LAB_0051c95b;
            }
          }
          bVar40 = false;
        }
        else {
          bVar40 = false;
        }
      }
LAB_0051c95b:
      dVar44 = 0.0;
      dVar45 = 0.0;
      if (((uVar36 == 0) && (bVar28)) && (bVar40 != false)) {
        dVar44 = pOVar6->m_srf_scale[0];
        dVar45 = pOVar6->m_srf_scale[1];
      }
      uVar35 = uVar36 + 1;
      iVar13 = iVar22 + iVar13;
      iVar29 = iVar2 + iVar29;
      if (bVar12 != false) {
        bVar43 = false;
        if (bVar37) {
          bVar12 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar6->field_0x270);
          if (bVar12) {
            bVar43 = ON_Interval::IsIncreasing((ON_Interval *)&pOVar6->field_0x280);
          }
          else {
            bVar43 = false;
          }
        }
        uVar5 = *(uint *)&pOVar6->m_packed_tex_rotate;
        bVar20 = (byte)uVar5;
        bVar12 = bVar43;
        if ((bVar21 & 1) != bVar20) {
          bVar12 = false;
        }
        uVar32 = uVar14 & 0xff;
        uVar14 = uVar32;
        if (iVar30 == 0 && (int)uVar33 == 0) {
          uVar14 = uVar5;
          bVar12 = bVar43;
        }
        if ((bVar21 & 1) == bVar20) {
          uVar14 = uVar32;
        }
        if (bVar12 == true) {
          bVar43 = bVar12;
          if (((byte)uVar14 & 1) != bVar20) {
            bVar43 = false;
          }
          if (uVar36 != 0) {
            uVar5 = uVar14;
            bVar12 = bVar43;
          }
          uVar14 = uVar5 & 0xff;
          ON_Interval::Union(&local_78,(ON_Interval *)&pOVar6->field_0x270);
          ON_Interval::Union(&local_68,(ON_Interval *)&pOVar6->field_0x280);
        }
      }
    }
    uVar36 = uVar35;
    uVar33 = uVar33 + 1;
  }
  if ((iVar30 < iVar29) || (iVar26 < iVar13)) {
    if ((!bVar28) || (bVar40 == false)) {
      local_98._0_8_ = ON_Interval::EmptyInterval.m_t[0];
      local_98._8_8_ = ON_Interval::EmptyInterval.m_t[1];
      local_88.m_t[0] = ON_Interval::EmptyInterval.m_t[0];
      local_88.m_t[1] = ON_Interval::EmptyInterval.m_t[1];
      dVar44 = 0.0;
      dVar45 = 0.0;
    }
    if ((!bVar37) || (bVar12 == false)) {
      local_78.m_t[0] = ON_Interval::EmptyInterval.m_t[0];
      local_78.m_t[1] = ON_Interval::EmptyInterval.m_t[1];
      local_68.m_t[0] = ON_Interval::EmptyInterval.m_t[0];
      local_68.m_t[1] = ON_Interval::EmptyInterval.m_t[1];
      bVar21 = 0;
    }
    *local_38 = (double)local_98._0_8_;
    local_38[1] = (double)local_98._8_8_;
    *local_40 = local_88.m_t[0];
    local_40[1] = local_88.m_t[1];
    this->m_srf_scale[0] = dVar44;
    this->m_srf_scale[1] = dVar45;
    *local_50 = local_78.m_t[0];
    local_50[1] = local_78.m_t[1];
    *local_48 = local_68.m_t[0];
    local_48[1] = local_68.m_t[1];
    this->m_packed_tex_rotate = (bool)(bVar21 & 1);
    ON_MeshTopology::Destroy(&this->m_top);
    newcap = (size_t)iVar29;
    ON_SimpleArray<ON_3fPoint>::Reserve(&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,newcap);
    ON_SimpleArray<ON_MeshFace>::Reserve(&this->m_F,(long)iVar13);
    for (uVar33 = 0; uVar33 != uVar31; uVar33 = uVar33 + 1) {
      pOVar6 = meshes[uVar33];
      if ((pOVar6 != (ON_Mesh *)0x0) &&
         (iVar30 = (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count, 0 < iVar30)) {
        iVar26 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
        iVar2 = (this->m_F).m_count;
        lVar27 = (long)iVar2;
        iVar3 = (pOVar6->m_F).m_count;
        if (0 < iVar3) {
          ON_SimpleArray<ON_MeshFace>::Append(&this->m_F,iVar3,(pOVar6->m_F).m_a);
          pOVar23 = (this->m_F).m_a + lVar27;
          for (; lVar27 < iVar2 + iVar3; lVar27 = lVar27 + 1) {
            iVar22 = pOVar23->vi[1];
            iVar4 = pOVar23->vi[2];
            iVar9 = pOVar23->vi[3];
            pOVar23->vi[0] = pOVar23->vi[0] + iVar26;
            pOVar23->vi[1] = iVar22 + iVar26;
            pOVar23->vi[2] = iVar4 + iVar26;
            pOVar23->vi[3] = iVar9 + iVar26;
            pOVar23 = pOVar23 + 1;
          }
        }
        ON_SimpleArray<ON_3fPoint>::Append
                  (&(this->m_V).super_ON_SimpleArray<ON_3fPoint>,iVar30,
                   (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a);
        if ((0 < (pOVar6->m_F).m_count) && ((pOVar6->m_Ngon).m_count != 0)) {
          puVar15 = NgonMap(pOVar6);
          ON_SimpleArray<unsigned_int>::Destroy(&this->m_NgonMap);
          uVar14 = NgonUnsignedCount(pOVar6);
          for (uVar36 = 0; uVar36 != uVar14; uVar36 = uVar36 + 1) {
            pOVar17 = Ngon(pOVar6,uVar36);
            if ((pOVar17 != (ON_MeshNgon *)0x0) &&
               (((pOVar17->m_Vcount != 0 || (pOVar17->m_Fcount != 0)) &&
                (pOVar17 = ON_MeshNgonAllocator::CopyNgon(&this->m_NgonAllocator,pOVar17),
                pOVar17 != (ON_MeshNgon *)0x0)))) {
              for (uVar24 = 0; uVar24 < pOVar17->m_Vcount; uVar24 = uVar24 + 1) {
                pOVar17->m_vi[uVar24] = pOVar17->m_vi[uVar24] + iVar26;
              }
              for (uVar24 = 0; uVar24 < pOVar17->m_Fcount; uVar24 = uVar24 + 1) {
                pOVar17->m_fi[uVar24] = pOVar17->m_fi[uVar24] + iVar2;
              }
              AddNgon(this,pOVar17);
            }
          }
          bVar41 = (bool)(bVar41 | puVar15 != (uint *)0x0);
        }
      }
    }
    bVar12 = bVar11;
    if (bVar11 != false) {
      ON_SimpleArray<ON_3dPoint>::Reserve(&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,newcap);
      for (uVar33 = 0; uVar31 != uVar33; uVar33 = uVar33 + 1) {
        pOVar6 = meshes[uVar33];
        if ((pOVar6 != (ON_Mesh *)0x0) &&
           (iVar30 = (pOVar6->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count, 0 < iVar30)) {
          ON_SimpleArray<ON_3dPoint>::Append
                    (&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>,iVar30,
                     (pOVar6->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_a);
        }
      }
      bVar12 = false;
      if ((this->m_dV).super_ON_SimpleArray<ON_3dPoint>.m_count == iVar29) {
        bVar12 = bVar11;
      }
    }
    if (bVar12 == false) {
      ON_SimpleArray<ON_3dPoint>::Destroy(&(this->m_dV).super_ON_SimpleArray<ON_3dPoint>);
    }
    pOVar1 = &this->m_N;
    if (bVar34) {
      ON_SimpleArray<ON_3fVector>::Reserve(&pOVar1->super_ON_SimpleArray<ON_3fVector>,newcap);
      for (uVar33 = 0; uVar31 != uVar33; uVar33 = uVar33 + 1) {
        pOVar6 = meshes[uVar33];
        if (pOVar6 != (ON_Mesh *)0x0) {
          ON_SimpleArray<ON_3fVector>::Append
                    (&pOVar1->super_ON_SimpleArray<ON_3fVector>,
                     (pOVar6->m_N).super_ON_SimpleArray<ON_3fVector>.m_count,
                     (pOVar6->m_N).super_ON_SimpleArray<ON_3fVector>.m_a);
        }
      }
    }
    else {
      ON_SimpleArray<ON_3fVector>::Destroy(&pOVar1->super_ON_SimpleArray<ON_3fVector>);
    }
    pOVar1 = &this->m_FN;
    if (bVar25) {
      ON_SimpleArray<ON_3fVector>::Reserve(&pOVar1->super_ON_SimpleArray<ON_3fVector>,(long)iVar13);
      for (uVar33 = 0; uVar31 != uVar33; uVar33 = uVar33 + 1) {
        pOVar6 = meshes[uVar33];
        if ((pOVar6 != (ON_Mesh *)0x0) &&
           (0 < (pOVar6->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count)) {
          ON_SimpleArray<ON_3fVector>::Append
                    (&pOVar1->super_ON_SimpleArray<ON_3fVector>,
                     (pOVar6->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count,
                     (pOVar6->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a);
        }
      }
    }
    else {
      ON_SimpleArray<ON_3fVector>::Destroy(&pOVar1->super_ON_SimpleArray<ON_3fVector>);
    }
    this_00 = &this->m_T;
    if (bVar37) {
      ON_SimpleArray<ON_2fPoint>::Reserve(&this_00->super_ON_SimpleArray<ON_2fPoint>,newcap);
      for (uVar33 = 0; uVar31 != uVar33; uVar33 = uVar33 + 1) {
        pOVar6 = meshes[uVar33];
        if (pOVar6 != (ON_Mesh *)0x0) {
          ON_SimpleArray<ON_2fPoint>::Append
                    (&this_00->super_ON_SimpleArray<ON_2fPoint>,
                     (pOVar6->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count,
                     (pOVar6->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a);
        }
      }
    }
    else {
      ON_SimpleArray<ON_2fPoint>::Destroy(&this_00->super_ON_SimpleArray<ON_2fPoint>);
    }
    this_01 = &this->m_S;
    if (bVar28) {
      ON_SimpleArray<ON_2dPoint>::Reserve(&this_01->super_ON_SimpleArray<ON_2dPoint>,newcap);
      for (uVar33 = 0; uVar31 != uVar33; uVar33 = uVar33 + 1) {
        pOVar6 = meshes[uVar33];
        if (pOVar6 != (ON_Mesh *)0x0) {
          ON_SimpleArray<ON_2dPoint>::Append
                    (&this_01->super_ON_SimpleArray<ON_2dPoint>,
                     (pOVar6->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count,
                     (pOVar6->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a);
        }
      }
    }
    else {
      ON_SimpleArray<ON_2dPoint>::Destroy(&this_01->super_ON_SimpleArray<ON_2dPoint>);
    }
    this_02 = &this->m_K;
    if (bVar18) {
      ON_SimpleArray<ON_SurfaceCurvature>::Reserve(this_02,newcap);
      for (uVar33 = 0; uVar31 != uVar33; uVar33 = uVar33 + 1) {
        pOVar6 = meshes[uVar33];
        if (pOVar6 != (ON_Mesh *)0x0) {
          ON_SimpleArray<ON_SurfaceCurvature>::Append
                    (this_02,(pOVar6->m_K).m_count,(pOVar6->m_K).m_a);
        }
      }
    }
    else {
      ON_SimpleArray<ON_SurfaceCurvature>::Destroy(this_02);
    }
    this_03 = &this->m_C;
    if (bVar19) {
      ON_SimpleArray<ON_Color>::Reserve(this_03,newcap);
      for (uVar33 = 0; uVar31 != uVar33; uVar33 = uVar33 + 1) {
        pOVar6 = meshes[uVar33];
        if (pOVar6 != (ON_Mesh *)0x0) {
          ON_SimpleArray<ON_Color>::Append(this_03,(pOVar6->m_C).m_count,(pOVar6->m_C).m_a);
        }
      }
    }
    else {
      ON_SimpleArray<ON_Color>::Destroy(this_03);
    }
    if (this->m_mesh_parameters != (ON_MeshParameters *)0x0) {
      for (uVar33 = 0; uVar31 != uVar33; uVar33 = uVar33 + 1) {
        if (meshes[uVar33] != (ON_Mesh *)0x0) {
          pOVar7 = meshes[uVar33]->m_mesh_parameters;
          a = this->m_mesh_parameters;
          if (pOVar7 != (ON_MeshParameters *)0x0) {
            bVar12 = ::operator!=(a,pOVar7);
            if (!bVar12) goto LAB_0051d0bd;
            a = this->m_mesh_parameters;
          }
          operator_delete(a,0xe0);
          this->m_mesh_parameters = (ON_MeshParameters *)0x0;
          break;
        }
LAB_0051d0bd:
      }
    }
    for (lVar27 = 0xd7; lVar27 != 0xdb; lVar27 = lVar27 + 1) {
      this_04 = (ON_MeshCurvatureStats *)
                (&(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object)[lVar27];
      if (this_04 != (ON_MeshCurvatureStats *)0x0) {
        ON_MeshCurvatureStats::~ON_MeshCurvatureStats(this_04);
        operator_delete(this_04,0x40);
        (&(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object)[lVar27] = (_func_int **)0x0;
      }
    }
    for (uVar33 = 0; uVar33 != uVar31; uVar33 = uVar33 + 1) {
      pOVar6 = meshes[uVar33];
      if (pOVar6 != (ON_Mesh *)0x0) {
        if (bVar39) {
          ON_ClassArray<ON_TextureCoordinates>::operator=(&this->m_TC,&pOVar6->m_TC);
          bVar39 = false;
        }
        else {
          for (iVar30 = 0; iVar30 < (this->m_TC).m_count; iVar30 = iVar30 + 1) {
            lVar27 = 0;
            bVar12 = false;
            for (lVar38 = 0; lVar38 < (pOVar6->m_TC).m_count; lVar38 = lVar38 + 1) {
              bVar18 = ::operator==(&(this->m_TC).m_a[iVar30].m_tag,
                                    (ON_MappingTag *)
                                    ((((pOVar6->m_TC).m_a)->m_tag).m_mapping_id.Data4 + lVar27 + -8)
                                   );
              if (bVar18) {
                pOVar8 = (pOVar6->m_TC).m_a;
                ON_SimpleArray<ON_3fPoint>::Append
                          (&(this->m_TC).m_a[iVar30].m_T,
                           *(int *)((long)&(pOVar8->m_T).m_count + lVar27),
                           *(ON_3fPoint **)((long)&(pOVar8->m_T).m_a + lVar27));
                bVar12 = true;
              }
              lVar27 = lVar27 + 0xb8;
            }
            if (!bVar12) {
              ON_ClassArray<ON_TextureCoordinates>::Remove(&this->m_TC,iVar30);
              iVar30 = iVar30 + -1;
            }
          }
          bVar39 = false;
        }
      }
    }
    this->m_mesh_is_closed = '\0';
    this->m_mesh_is_manifold = '\0';
    this->m_mesh_is_oriented = '\0';
    this->m_mesh_is_solid = '\0';
    InvalidateBoundingBoxes(this);
    iVar30 = NgonCount(this);
    if ((bool)(0 < iVar30 & bVar41)) {
      CreateNgonMap(this);
    }
    if (((bVar42) && (local_e8 != (ON_MeshParameters *)0x0)) &&
       (local_e8 != this->m_mesh_parameters)) {
      SetMeshParameters(this,local_e8);
    }
  }
  return;
}

Assistant:

void ON_Mesh::Append(int mesh_count, const ON_Mesh* const* meshes)
{
  if (mesh_count <= 0 || 0 == meshes)
    return;

  int mi;
  int vcount0 = VertexCount();
  if (vcount0 <= 0)
    m_F.SetCount(0);
  int fcount0 = FaceCount();
  int* vi;
  int j;
  const ON_Mesh* m;

  // The calls to Has*() must happen before the m_V[] and m_F[] arrays get enlarged
  // Allow the appendage of VertexNormals, TextureCoordinates, PrincipalCurvatures to empty meshes
  // by checking for 0 == vcount0 && 0 == fcount0
  bool bHasVertexNormals = (0 == vcount0 || HasVertexNormals());
  bool bHasFaceNormals = (0 == vcount0 || 0 == fcount0 || HasFaceNormals());
  bool bHasTextureCoordinates = (0 == vcount0 || HasTextureCoordinates());
  bool bHasPrincipalCurvatures = (0 == vcount0 || HasPrincipalCurvatures());
  bool bHasVertexColors = (0 == vcount0 || HasVertexColors());
  bool bHasSurfaceParameters = (0 == vcount0 || HasSurfaceParameters());
  bool bHasDoubles = (0 == vcount0 || HasSynchronizedDoubleAndSinglePrecisionVertices());
  bool bHasNgonMap = (NgonCount() > 0 && 0 != NgonMap());

  bool bSetMeshParameters = true;
  const ON_MeshParameters* mp = nullptr;
  ON_SHA1_Hash mp_hash = ON_SHA1_Hash::EmptyContentHash;
  if (0 != vcount0)
  {
    mp = this->MeshParameters();
    if (nullptr == mp)
      bSetMeshParameters = false;
    else
      mp_hash = mp->GeometrySettingsHash();
  }

  bool bHasSurfaceDomain
    = bHasSurfaceParameters
    && (0 == vcount0 || (m_srf_domain[0].IsIncreasing() && m_srf_domain[1].IsIncreasing()));

  ON_Interval srf_domain[2];
  srf_domain[0] = (bHasSurfaceDomain && vcount0 > 0) ? m_srf_domain[0] : ON_Interval::EmptyInterval;
  srf_domain[1] = (bHasSurfaceDomain && vcount0 > 0) ? m_srf_domain[1] : ON_Interval::EmptyInterval;

  bool bHasTexturePackingDomain
    = bHasTextureCoordinates
    && (0 == vcount0 || (m_packed_tex_domain[0].IsIncreasing() && m_packed_tex_domain[1].IsIncreasing()));

  ON_Interval packed_tex_domain[2];
  packed_tex_domain[0] = (bHasTexturePackingDomain && vcount0 > 0) ? m_packed_tex_domain[0] : ON_Interval::EmptyInterval;
  packed_tex_domain[1] = (bHasTexturePackingDomain && vcount0 > 0) ? m_packed_tex_domain[1] : ON_Interval::EmptyInterval;
  bool packed_tex_rotate = (bHasTexturePackingDomain && m_packed_tex_rotate) ? true : false;

  double srf_scale[2] = { m_srf_scale[0], m_srf_scale[1] };

  int fcount = fcount0;
  int vcount = vcount0;
  unsigned int merged_count = vcount0 > 0 ? 1 : 0;
  for (mi = 0; mi < mesh_count; mi++)
  {
    m = meshes[mi];
    if (0 == m)
      continue;
    int vcount1 = m->m_V.Count();
    if (vcount1 <= 0)
      continue;

    merged_count++;

    if (bSetMeshParameters)
    {
      const ON_MeshParameters* this_mesh_mp = m->MeshParameters();
      if (nullptr == this_mesh_mp)
        bSetMeshParameters = false;
      else
      {
        const ON_SHA1_Hash this_mesh_mp_hash = this_mesh_mp->GeometrySettingsHash();
        if (nullptr == mp)
        {
          // first mesh parameters.
          mp = this_mesh_mp;
          mp_hash = this_mesh_mp_hash;
        }
        else
        {
          if (this_mesh_mp_hash != mp_hash)
          {
            // variable mesh paramters - means output gets none.
            bSetMeshParameters = false;
          }
        }
      }
    }

    int fcount1 = m->m_F.Count();
    if (fcount1 > 0)
      fcount += fcount1;
    vcount += vcount1;
    if (bHasVertexNormals && !m->HasVertexNormals())
      bHasVertexNormals = false;
    if (bHasTextureCoordinates && !m->HasTextureCoordinates())
      bHasTextureCoordinates = false;
    if (bHasPrincipalCurvatures && !m->HasPrincipalCurvatures())
      bHasPrincipalCurvatures = false;
    if (bHasVertexColors && !m->HasVertexColors())
      bHasVertexColors = false;
    if (bHasSurfaceParameters && !m->HasSurfaceParameters())
      bHasSurfaceParameters = false;
    if (bHasDoubles && !m->HasSynchronizedDoubleAndSinglePrecisionVertices())
      bHasDoubles = false;
    if (bHasFaceNormals && fcount1 > 0 && !m->HasFaceNormals())
      bHasFaceNormals = false;

    if (bHasSurfaceDomain)
    {
      bHasSurfaceDomain
        = bHasSurfaceParameters
        && m->m_srf_domain[0].IsIncreasing()
        && m->m_srf_domain[1].IsIncreasing();
      if (bHasSurfaceDomain)
      {
        srf_domain[0].Union(m->m_srf_domain[0]);
        srf_domain[1].Union(m->m_srf_domain[1]);
      }
    }

    if (1 == merged_count && bHasSurfaceParameters && bHasSurfaceDomain)
    {
      srf_scale[0] = m->m_srf_scale[0];
      srf_scale[1] = m->m_srf_scale[1];
    }
    else
    {
      srf_scale[0] = 0.0;
      srf_scale[1] = 0.0;
    }

    if (bHasTexturePackingDomain)
    {
      // 2014-04-01 Dale Lear
      //   Trying to merger packed_tex_domain[] intervals
      //   is questionable at best.
      //   A strong argument can be made for simply deleting
      //   packed texture domain information when there are
      //   two non-empty meshes that are merged.
      bHasTexturePackingDomain
        = bHasTextureCoordinates
        && m->m_packed_tex_domain[0].IsIncreasing()
        && m->m_packed_tex_domain[1].IsIncreasing();
      if (packed_tex_rotate != (m->m_packed_tex_rotate ? true : false))
      {
        if (0 == vcount0 && 0 == mi)
        {
          packed_tex_rotate = (m->m_packed_tex_rotate ? true : false);
        }
        else
        {
          bHasTexturePackingDomain = false;
        }
      }
      if (bHasTexturePackingDomain)
      {
        if (1 == merged_count)
        {
          packed_tex_rotate = (m->m_packed_tex_rotate ? true : false);
        }
        else if (packed_tex_rotate != (m->m_packed_tex_rotate ? true : false))
        {
          bHasTexturePackingDomain = false;
        }
        packed_tex_domain[0].Union(m->m_packed_tex_domain[0]);
        packed_tex_domain[1].Union(m->m_packed_tex_domain[1]);
      }
    }
  }


  if (vcount <= vcount0 && fcount <= fcount0)
    return;

  if (!bHasSurfaceParameters || !bHasSurfaceDomain)
  {
    srf_domain[0] = ON_Interval::EmptyInterval;
    srf_domain[1] = ON_Interval::EmptyInterval;
    srf_scale[0] = 0.0;
    srf_scale[1] = 0.0;
  }

  if (!bHasTextureCoordinates || !bHasTexturePackingDomain)
  {
    packed_tex_domain[0] = ON_Interval::EmptyInterval;
    packed_tex_domain[1] = ON_Interval::EmptyInterval;
    packed_tex_rotate = false;
  }

  m_srf_domain[0] = srf_domain[0];
  m_srf_domain[1] = srf_domain[1];
  m_srf_scale[0] = srf_scale[0];
  m_srf_scale[1] = srf_scale[1];

  m_packed_tex_domain[0] = packed_tex_domain[0];
  m_packed_tex_domain[1] = packed_tex_domain[1];
  m_packed_tex_rotate = packed_tex_rotate;

  m_top.Destroy();

  // It is critical to call DoublePrecisionVertices() before 
  // we modify m_V[] because DoublePrecisionVertices() will
  // attempt to update the double precision information
  // when it notices that m_V has new vertices added.

  m_V.Reserve(vcount);
  m_F.Reserve(fcount);
  for (mi = 0; mi < mesh_count; mi++)
  {
    const unsigned int vcount0_local = m_V.UnsignedCount();
    const unsigned int fcount0_local = m_F.UnsignedCount();
    m = meshes[mi];
    if (0 == m)
      continue;
    int vcount1 = m->m_V.Count();
    if (vcount1 <= 0)
      continue;
    int fcount1 = m->m_F.Count();
    if (fcount1 > 0)
    {
      j = m_F.Count();
      m_F.Append(fcount1, m->m_F.Array());
      fcount1 += j;
      while (j < fcount1)
      {
        vi = m_F[j].vi;
        vi[0] += (int)vcount0_local;
        vi[1] += (int)vcount0_local;
        vi[2] += (int)vcount0_local;
        vi[3] += (int)vcount0_local;
        j++;
      }
    }
    m_V.Append(vcount1, m->m_V.Array());
    if (m->HasNgons())
    {
      if (0 != m->NgonMap())
        bHasNgonMap = true;
      m_NgonMap.Destroy();
      unsigned int ngon_count = m->NgonUnsignedCount();
      for (unsigned int ni = 0; ni < ngon_count; ni++)
      {
        const ON_MeshNgon* ngon0 = m->Ngon(ni);
        if (0 == ngon0)
          continue;
        if (0 == ngon0->m_Vcount && 0 == ngon0->m_Fcount)
          continue;
        ON_MeshNgon* ngon1 = this->m_NgonAllocator.CopyNgon(ngon0);
        if (0 == ngon1)
          continue;
        for (unsigned int nvi = 0; nvi < ngon1->m_Vcount; nvi++)
        {
          ngon1->m_vi[nvi] += vcount0_local;
        }
        for (unsigned int nfi = 0; nfi < ngon1->m_Fcount; nfi++)
        {
          ngon1->m_fi[nfi] += fcount0_local;
        }
        this->AddNgon(ngon1);
      }
    }
  }

  if (bHasDoubles)
  {
    // Now update the double precision vertex locations.
    m_dV.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m || m->m_dV.Count() <= 0)
        continue;
      m_dV.Append(m->m_dV.Count(), m->m_dV.Array());
    }
    if (m_dV.Count() != vcount)
      bHasDoubles = false;
  }

  if (false == bHasDoubles)
  {
    bHasDoubles = false;
    DestroyDoublePrecisionVertices();
  }

  if (bHasVertexNormals)
  {
    m_N.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_N.Append(m->m_N.Count(), m->m_N.Array());
    }
  }
  else
  {
    m_N.Destroy();
  }


  if (bHasFaceNormals)
  {
    m_FN.Reserve(fcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m || m->m_V.Count() <= 0)
        continue;
      m_FN.Append(m->m_FN.Count(), m->m_FN.Array());
    }
  }
  else
  {
    m_FN.Destroy();
  }

  if (bHasTextureCoordinates)
  {
    m_T.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_T.Append(m->m_T.Count(), m->m_T.Array());
    }
  }
  else
  {
    m_T.Destroy();
  }


  if (bHasSurfaceParameters)
  {
    m_S.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_S.Append(m->m_S.Count(), m->m_S.Array());
    }
  }
  else
  {
    m_S.Destroy();
  }

  if (bHasPrincipalCurvatures)
  {
    m_K.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_K.Append(m->m_K.Count(), m->m_K.Array());
    }
  }
  else
  {
    m_K.Destroy();
  }

  if (bHasVertexColors)
  {
    m_C.Reserve(vcount);
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      m_C.Append(m->m_C.Count(), m->m_C.Array());
    }
  }
  else
  {
    m_C.Destroy();
  }

  if (0 != m_mesh_parameters)
  {
    for (mi = 0; mi < mesh_count; mi++)
    {
      m = meshes[mi];
      if (0 == m)
        continue;
      if (0 == m->m_mesh_parameters || *m_mesh_parameters != *m->m_mesh_parameters)
      {
        delete m_mesh_parameters;
        m_mesh_parameters = 0;
        break;
      }
    }
  }

  for (j = 0; j < 4; j++)
  {
    if (m_kstat[j])
    {
      // will be recomputed if required
      delete m_kstat[j];
      m_kstat[j] = 0;
    }
  }

  bool bAllowNewCachedTCs = (vcount0 == 0);
  for (mi = 0; mi < mesh_count; mi++)
  {
    m = meshes[mi];
    if (0 == m)
      continue;

    if (bAllowNewCachedTCs)
    {
      m_TC = m->m_TC;
      bAllowNewCachedTCs = false;
    }
    else
    {
      for (int tci = 0; tci < m_TC.Count(); tci++)
      {
        bool bKeep = false;
        for (int tcimi = 0; tcimi < m->m_TC.Count(); tcimi++)
        {
          if (m_TC[tci].m_tag == m->m_TC[tcimi].m_tag)
          {
            m_TC[tci].m_T.Append(m->m_TC[tcimi].m_T.Count(), m->m_TC[tcimi].m_T.Array());
            bKeep = true;
          }
        }
        if (!bKeep)
        {
          m_TC.Remove(tci);
          tci--;
        }
      }
    }
  }

  SetClosed(-99);
  SetSolidOrientation(-99);
  InvalidateBoundingBoxes();

  if (NgonCount() > 0 && bHasNgonMap)
    CreateNgonMap();

  if (bSetMeshParameters && nullptr != mp && mp != this->MeshParameters())
  {
    // Appending to an empty this and all appendees have matching mesh parameters.
    this->SetMeshParameters(*mp);
  }
}